

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

Type * __thiscall
slang::ast::GenericClassDefSymbol::getSpecializationImpl
          (GenericClassDefSymbol *this,ASTContext *context,SourceLocation instanceLoc,
          bool forceInvalidParams,ParameterValueAssignmentSyntax *syntax)

{
  group_type_pointer pgVar1;
  size_t *psVar2;
  SymbolIndex SVar3;
  Compilation *pCVar4;
  Scope *scope;
  size_type sVar5;
  ParameterSymbol *this_00;
  group_type_pointer pgVar6;
  value_type_pointer ppVar7;
  ulong uVar8;
  _func_void_intptr_t_Compilation_ptr_ClassType_ptr_SourceLocation *p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> parameterDecls;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  Diagnostic *this_01;
  ParameterSymbolBase *pPVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SourceLocation SVar17;
  undefined7 in_register_00000009;
  ulong uVar18;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *pEVar19;
  __extent_storage<18446744073709551615UL> src;
  __extent_storage<18446744073709551615UL> extraout_RDX_02;
  long lVar20;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
  *ptVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  SourceLocation other;
  ParameterDecl *decl;
  pointer decl_00;
  ClassType *pCVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> typeParams_00;
  SourceRange referencingRange;
  span<const_slang::ConstantValue_*const,_18446744073709551615UL> paramValues_00;
  SourceLocation in_stack_fffffffffffffcf8;
  try_emplace_args_t local_2f9;
  ClassType *classType;
  GenericClassDefSymbol *local_2f0;
  ClassType *local_2e8;
  SourceLocation local_2e0;
  Compilation *local_2d8;
  ulong local_2d0;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
  *local_2c8;
  ulong local_2c0;
  undefined8 local_2b8;
  uchar uStack_2b0;
  uchar uStack_2af;
  uchar uStack_2ae;
  uchar uStack_2ad;
  uchar uStack_2ac;
  uchar uStack_2ab;
  uchar uStack_2aa;
  uchar uStack_2a9;
  ulong local_2a8;
  ulong local_2a0;
  ulong local_298;
  locator res;
  ClassSpecializationKey key;
  SmallVector<const_slang::ast::Type_*,_5UL> typeParams;
  SmallVector<const_slang::ConstantValue_*,_5UL> paramValues;
  ParameterBuilder paramBuilder;
  
  pCVar4 = ((context->scope).ptr)->compilation;
  scope = (this->super_Symbol).parentScope;
  uVar14 = this->recursionDepth + 1;
  this->recursionDepth = uVar14;
  local_2b8 = syntax;
  if ((pCVar4->options).maxRecursiveClassSpecialization < uVar14) {
    this_01 = ASTContext::addDiag(context,(DiagCode)0x1f0009,instanceLoc);
    Diagnostic::operator<<(this_01,(this->super_Symbol).name);
    pCVar28 = (ClassType *)pCVar4->errorType;
    goto LAB_0023bd1b;
  }
  local_2f0 = this;
  classType = BumpAllocator::
              emplace<slang::ast::ClassType,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                        (&pCVar4->super_BumpAllocator,pCVar4,&(this->super_Symbol).name,
                         &(this->super_Symbol).location);
  classType->genericClass = this;
  bVar13 = true;
  if (!forceInvalidParams) {
    bVar13 = Scope::isUninstantiated((context->scope).ptr);
  }
  classType->isUninstantiated = bVar13;
  SVar3 = (this->super_Symbol).indexInScope;
  (classType->super_Type).super_Symbol.parentScope = scope;
  (classType->super_Type).super_Symbol.indexInScope = SVar3;
  parameterDecls._M_ptr =
       (this->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.data_;
  parameterDecls._M_extent._M_extent_value =
       (this->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len;
  ParameterBuilder::ParameterBuilder
            (&paramBuilder,(context->scope).ptr,(this->super_Symbol).name,parameterDecls);
  paramBuilder.suppressErrors = local_2b8 == (ParameterValueAssignmentSyntax *)0x0;
  paramBuilder.instanceContext = context;
  paramBuilder.forceInvalidValues = forceInvalidParams;
  if (!paramBuilder.suppressErrors) {
    ParameterBuilder::setAssignments(&paramBuilder,local_2b8,false);
  }
  local_2e0._0_4_ = (int)CONCAT71(in_register_00000009,forceInvalidParams);
  paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.data_ =
       (pointer)paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.firstElement;
  paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.len = 0;
  paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.cap = 5;
  pEVar19 = (EVP_PKEY_CTX *)typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.firstElement;
  typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.len = 0;
  typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.cap = 5;
  sVar5 = (this->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len;
  bVar13 = sVar5 == 0;
  other = instanceLoc;
  local_2d8 = pCVar4;
  typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.data_ = (pointer)pEVar19;
  if (!bVar13) {
    other = (SourceLocation)
            ((long)instanceLoc * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
            (ulong)(instanceLoc._0_4_ & 0xfffffff));
    decl_00 = (this->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.
              data_;
    lVar20 = sVar5 << 6;
    do {
      pPVar16 = ParameterBuilder::createParam
                          (&paramBuilder,decl_00,&classType->super_Scope,instanceLoc);
      bVar12 = paramBuilder.anyErrors;
      pEVar19 = extraout_RDX;
      if (paramBuilder.anyErrors == true) {
        if (local_2b8 == (ParameterValueAssignmentSyntax *)0x0) {
          local_2e8 = (ClassType *)0x0;
        }
        else {
          local_2e8 = (ClassType *)local_2d8->errorType;
        }
      }
      else if (pPVar16->isLocal == false) {
        this_00 = (ParameterSymbol *)pPVar16->symbol;
        if ((this_00->super_ValueSymbol).super_Symbol.kind == Parameter) {
          referencingRange.endLoc = other;
          referencingRange.startLoc = instanceLoc;
          key.paramValues._M_ptr = (pointer)ParameterSymbol::getValue(this_00,referencingRange);
          SmallVectorBase<slang::ConstantValue_const*>::emplace_back<slang::ConstantValue_const*>
                    ((SmallVectorBase<slang::ConstantValue_const*> *)&paramValues,
                     (ConstantValue **)&key);
          pEVar19 = extraout_RDX_00;
        }
        else {
          key.paramValues._M_ptr =
               (pointer)DeclaredType::getType
                                  ((DeclaredType *)
                                   &(this_00->super_ValueSymbol).declaredType.dimensions);
          SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                    ((SmallVectorBase<slang::ast::Type_const*> *)&typeParams,(Type **)&key);
          pEVar19 = extraout_RDX_01;
        }
      }
      if (bVar12 != false) break;
      decl_00 = decl_00 + 1;
      lVar20 = lVar20 + -0x40;
      bVar13 = lVar20 == 0;
    } while (!bVar13);
  }
  pCVar4 = local_2d8;
  this = local_2f0;
  pCVar28 = local_2e8;
  if (bVar13) {
    if (local_2e0._0_1_ == '\0') {
      iVar15 = SmallVectorBase<const_slang::ConstantValue_*>::copy
                         (&paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>,
                          (EVP_PKEY_CTX *)local_2d8,pEVar19);
      paramValues_00._M_ptr._4_4_ = extraout_var;
      paramValues_00._M_ptr._0_4_ = iVar15;
      iVar15 = SmallVectorBase<const_slang::ast::Type_*>::copy
                         (&typeParams.super_SmallVectorBase<const_slang::ast::Type_*>,
                          (EVP_PKEY_CTX *)pCVar4,(EVP_PKEY_CTX *)src._M_extent_value);
      typeParams_00._M_ptr._4_4_ = extraout_var_00;
      typeParams_00._M_ptr._0_4_ = iVar15;
      typeParams_00._M_extent._M_extent_value = extraout_RDX_02._M_extent_value;
      paramValues_00._M_extent._M_extent_value = src._M_extent_value;
      detail::ClassSpecializationKey::ClassSpecializationKey(&key,paramValues_00,typeParams_00);
      local_2e0 = instanceLoc;
      if (classType->isUninstantiated == true) {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = key.savedHash;
        ptVar21 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
                   *)&this->uninstantiatedSpecMap;
        uVar27 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar10,8) ^
                 SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar10,0);
        uVar23 = uVar27 >> ((byte)(this->uninstantiatedSpecMap).table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                                  .arrays.groups_size_index & 0x3f);
        lVar20 = (uVar27 & 0xff) * 4;
        uVar31 = (&UNK_004b638c)[lVar20];
        uVar32 = (&UNK_004b638d)[lVar20];
        uVar33 = (&UNK_004b638e)[lVar20];
        uVar34 = (&UNK_004b638f)[lVar20];
        uVar18 = (ulong)((uint)uVar27 & 7);
        uVar25 = 0;
        uVar24 = uVar23;
        uVar35 = uVar31;
        uVar36 = uVar32;
        uVar37 = uVar33;
        uVar38 = uVar34;
        uVar39 = uVar31;
        uVar40 = uVar32;
        uVar41 = uVar33;
        uVar42 = uVar34;
        uVar43 = uVar31;
        uVar44 = uVar32;
        uVar45 = uVar33;
        uVar46 = uVar34;
        do {
          pgVar6 = (this->uninstantiatedSpecMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                   .arrays.groups_;
          pgVar1 = pgVar6 + uVar23;
          auVar29[0] = -(pgVar1->m[0].n == uVar31);
          auVar29[1] = -(pgVar1->m[1].n == uVar32);
          auVar29[2] = -(pgVar1->m[2].n == uVar33);
          auVar29[3] = -(pgVar1->m[3].n == uVar34);
          auVar29[4] = -(pgVar1->m[4].n == uVar35);
          auVar29[5] = -(pgVar1->m[5].n == uVar36);
          auVar29[6] = -(pgVar1->m[6].n == uVar37);
          auVar29[7] = -(pgVar1->m[7].n == uVar38);
          auVar29[8] = -(pgVar1->m[8].n == uVar39);
          auVar29[9] = -(pgVar1->m[9].n == uVar40);
          auVar29[10] = -(pgVar1->m[10].n == uVar41);
          auVar29[0xb] = -(pgVar1->m[0xb].n == uVar42);
          auVar29[0xc] = -(pgVar1->m[0xc].n == uVar43);
          auVar29[0xd] = -(pgVar1->m[0xd].n == uVar44);
          auVar29[0xe] = -(pgVar1->m[0xe].n == uVar45);
          auVar29[0xf] = -(pgVar1->m[0xf].n == uVar46);
          uVar14 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe);
          uVar22 = uVar23;
          uVar26 = uVar25;
          if (uVar14 != 0) {
            ppVar7 = (this->uninstantiatedSpecMap).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                     .arrays.elements_;
            local_2b8._0_2_ = CONCAT11(uVar32,uVar31);
            local_2b8._0_3_ = CONCAT12(uVar33,(undefined2)local_2b8);
            local_2b8._0_4_ = CONCAT13(uVar34,(undefined3)local_2b8);
            local_2b8._0_5_ = CONCAT14(uVar35,(undefined4)local_2b8);
            local_2b8._0_6_ = CONCAT15(uVar36,(undefined5)local_2b8);
            local_2b8._0_7_ = CONCAT16(uVar37,(undefined6)local_2b8);
            local_2b8 = (ParameterValueAssignmentSyntax *)CONCAT17(uVar38,(undefined7)local_2b8);
            SVar17 = other;
            local_2d0 = uVar24;
            local_2c8 = ptVar21;
            local_2c0 = uVar27;
            uStack_2b0 = uVar39;
            uStack_2af = uVar40;
            uStack_2ae = uVar41;
            uStack_2ad = uVar42;
            uStack_2ac = uVar43;
            uStack_2ab = uVar44;
            uStack_2aa = uVar45;
            uStack_2a9 = uVar46;
            local_2a8 = uVar25;
            local_2a0 = uVar23;
            local_298 = uVar18;
            do {
              iVar15 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                }
              }
              other = (SourceLocation)
                      ((long)&ppVar7[uVar23 * 0xf].first.paramValues._M_ptr +
                      (ulong)(uint)(iVar15 * 0x30));
              bVar13 = detail::ClassSpecializationKey::operator==
                                 (&key,(ClassSpecializationKey *)other);
              if (!bVar13) {
                uVar14 = uVar14 - 1 & uVar14;
                other = SVar17;
              }
              ptVar21 = local_2c8;
              uVar24 = local_2d0;
              uVar27 = local_2c0;
              this = local_2f0;
              if (bVar13) goto LAB_0023bb96;
              SVar17 = other;
            } while (uVar14 != 0);
            uVar18 = local_298;
            uVar22 = local_2a0;
            uVar26 = local_2a8;
            uVar31 = (uchar)local_2b8;
            uVar32 = local_2b8._1_1_;
            uVar33 = local_2b8._2_1_;
            uVar34 = local_2b8._3_1_;
            uVar35 = local_2b8._4_1_;
            uVar36 = local_2b8._5_1_;
            uVar37 = local_2b8._6_1_;
            uVar38 = local_2b8._7_1_;
            uVar39 = uStack_2b0;
            uVar40 = uStack_2af;
            uVar41 = uStack_2ae;
            uVar42 = uStack_2ad;
            uVar43 = uStack_2ac;
            uVar44 = uStack_2ab;
            uVar45 = uStack_2aa;
            uVar46 = uStack_2a9;
            if (bVar13) goto LAB_0023bb96;
          }
          if ((pgVar6[uVar23].m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[uVar18]) == 0) break;
          uVar8 = (this->uninstantiatedSpecMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_mask;
          uVar25 = uVar26 + 1;
          uVar23 = uVar22 + uVar26 + 1 & uVar8;
        } while (uVar25 <= uVar8);
        other = (SourceLocation)0x0;
LAB_0023bb96:
        SVar17 = other;
        if (other == (SourceLocation)0x0) {
          if ((this->uninstantiatedSpecMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size <
              (this->uninstantiatedSpecMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
              .size_ctrl.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                      (&res,ptVar21,(arrays_type *)ptVar21,uVar24,uVar27,&local_2f9,&key,&classType)
            ;
            psVar2 = &(this->uninstantiatedSpecMap).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                      .size_ctrl.size;
            *psVar2 = *psVar2 + 1;
            SVar17 = (SourceLocation)res.p;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                      (&res,ptVar21,uVar27,&local_2f9,&key,&classType);
            SVar17 = (SourceLocation)res.p;
          }
        }
      }
      else {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = key.savedHash;
        ptVar21 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
                   *)&this->specMap;
        uVar27 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar11,8) ^
                 SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar11,0);
        uVar23 = uVar27 >> ((byte)(this->specMap).table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                                  .arrays.groups_size_index & 0x3f);
        lVar20 = (uVar27 & 0xff) * 4;
        uVar31 = (&UNK_004b638c)[lVar20];
        uVar32 = (&UNK_004b638d)[lVar20];
        uVar33 = (&UNK_004b638e)[lVar20];
        uVar34 = (&UNK_004b638f)[lVar20];
        uVar18 = (ulong)((uint)uVar27 & 7);
        uVar25 = 0;
        uVar24 = uVar23;
        uVar35 = uVar31;
        uVar36 = uVar32;
        uVar37 = uVar33;
        uVar38 = uVar34;
        uVar39 = uVar31;
        uVar40 = uVar32;
        uVar41 = uVar33;
        uVar42 = uVar34;
        uVar43 = uVar31;
        uVar44 = uVar32;
        uVar45 = uVar33;
        uVar46 = uVar34;
        do {
          pgVar6 = (this->specMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                   .arrays.groups_;
          pgVar1 = pgVar6 + uVar23;
          auVar30[0] = -(pgVar1->m[0].n == uVar31);
          auVar30[1] = -(pgVar1->m[1].n == uVar32);
          auVar30[2] = -(pgVar1->m[2].n == uVar33);
          auVar30[3] = -(pgVar1->m[3].n == uVar34);
          auVar30[4] = -(pgVar1->m[4].n == uVar35);
          auVar30[5] = -(pgVar1->m[5].n == uVar36);
          auVar30[6] = -(pgVar1->m[6].n == uVar37);
          auVar30[7] = -(pgVar1->m[7].n == uVar38);
          auVar30[8] = -(pgVar1->m[8].n == uVar39);
          auVar30[9] = -(pgVar1->m[9].n == uVar40);
          auVar30[10] = -(pgVar1->m[10].n == uVar41);
          auVar30[0xb] = -(pgVar1->m[0xb].n == uVar42);
          auVar30[0xc] = -(pgVar1->m[0xc].n == uVar43);
          auVar30[0xd] = -(pgVar1->m[0xd].n == uVar44);
          auVar30[0xe] = -(pgVar1->m[0xe].n == uVar45);
          auVar30[0xf] = -(pgVar1->m[0xf].n == uVar46);
          uVar14 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
          uVar22 = uVar23;
          uVar26 = uVar25;
          if (uVar14 != 0) {
            ppVar7 = (this->specMap).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                     .arrays.elements_;
            local_2b8._0_2_ = CONCAT11(uVar32,uVar31);
            local_2b8._0_3_ = CONCAT12(uVar33,(undefined2)local_2b8);
            local_2b8._0_4_ = CONCAT13(uVar34,(undefined3)local_2b8);
            local_2b8._0_5_ = CONCAT14(uVar35,(undefined4)local_2b8);
            local_2b8._0_6_ = CONCAT15(uVar36,(undefined5)local_2b8);
            local_2b8._0_7_ = CONCAT16(uVar37,(undefined6)local_2b8);
            local_2b8 = (ParameterValueAssignmentSyntax *)CONCAT17(uVar38,(undefined7)local_2b8);
            SVar17 = other;
            local_2d0 = uVar24;
            local_2c8 = ptVar21;
            local_2c0 = uVar27;
            uStack_2b0 = uVar39;
            uStack_2af = uVar40;
            uStack_2ae = uVar41;
            uStack_2ad = uVar42;
            uStack_2ac = uVar43;
            uStack_2ab = uVar44;
            uStack_2aa = uVar45;
            uStack_2a9 = uVar46;
            local_2a8 = uVar25;
            local_2a0 = uVar23;
            local_298 = uVar18;
            do {
              iVar15 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                }
              }
              other = (SourceLocation)
                      ((long)&ppVar7[uVar23 * 0xf].first.paramValues._M_ptr +
                      (ulong)(uint)(iVar15 * 0x30));
              bVar13 = detail::ClassSpecializationKey::operator==
                                 (&key,(ClassSpecializationKey *)other);
              if (!bVar13) {
                uVar14 = uVar14 - 1 & uVar14;
                other = SVar17;
              }
              ptVar21 = local_2c8;
              uVar24 = local_2d0;
              uVar27 = local_2c0;
              this = local_2f0;
              if (bVar13) goto LAB_0023bc01;
              SVar17 = other;
            } while (uVar14 != 0);
            uVar18 = local_298;
            uVar22 = local_2a0;
            uVar26 = local_2a8;
            uVar31 = (uchar)local_2b8;
            uVar32 = local_2b8._1_1_;
            uVar33 = local_2b8._2_1_;
            uVar34 = local_2b8._3_1_;
            uVar35 = local_2b8._4_1_;
            uVar36 = local_2b8._5_1_;
            uVar37 = local_2b8._6_1_;
            uVar38 = local_2b8._7_1_;
            uVar39 = uStack_2b0;
            uVar40 = uStack_2af;
            uVar41 = uStack_2ae;
            uVar42 = uStack_2ad;
            uVar43 = uStack_2ac;
            uVar44 = uStack_2ab;
            uVar45 = uStack_2aa;
            uVar46 = uStack_2a9;
            if (bVar13) goto LAB_0023bc01;
          }
          if ((pgVar6[uVar23].m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[uVar18]) == 0) break;
          uVar8 = (this->specMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_mask;
          uVar25 = uVar26 + 1;
          uVar23 = uVar22 + uVar26 + 1 & uVar8;
        } while (uVar25 <= uVar8);
        other = (SourceLocation)0x0;
LAB_0023bc01:
        SVar17 = other;
        if (other == (SourceLocation)0x0) {
          if ((this->specMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size <
              (this->specMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
              .size_ctrl.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                      (&res,ptVar21,(arrays_type *)ptVar21,uVar24,uVar27,&local_2f9,&key,&classType)
            ;
            psVar2 = &(this->specMap).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                      .size_ctrl.size;
            *psVar2 = *psVar2 + 1;
            SVar17 = (SourceLocation)res.p;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                      (&res,ptVar21,uVar27,&local_2f9,&key,&classType);
            SVar17 = (SourceLocation)res.p;
          }
        }
      }
      if (other != (SourceLocation)0x0) {
        local_2e8 = *(ClassType **)((long)SVar17 + 0x28);
        pCVar28 = local_2e8;
        goto LAB_0023bcd6;
      }
    }
    p_Var9 = (this->specializeFunc).callback;
    if (p_Var9 == (_func_void_intptr_t_Compilation_ptr_ClassType_ptr_SourceLocation *)0x0) {
      ClassType::populate(classType,scope,
                          (ClassDeclarationSyntax *)(this->super_Symbol).originatingSyntax);
      pCVar28 = classType;
    }
    else {
      (*p_Var9)((this->specializeFunc).callable,local_2d8,classType,in_stack_fffffffffffffcf8);
      pCVar28 = classType;
    }
  }
LAB_0023bcd6:
  if (typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.data_ !=
      (pointer)typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.firstElement) {
    operator_delete(typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.data_);
  }
  if (paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.data_ !=
      (pointer)paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.firstElement) {
    operator_delete(paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.data_);
  }
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::delete_((allocator_type)paramBuilder.assignments.super_Storage._264_8_,
            (table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)&paramBuilder.assignments.field_0x110);
LAB_0023bd1b:
  this->recursionDepth = this->recursionDepth - 1;
  return &pCVar28->super_Type;
}

Assistant:

const Type* GenericClassDefSymbol::getSpecializationImpl(
    const ASTContext& context, SourceLocation instanceLoc, bool forceInvalidParams,
    const ParameterValueAssignmentSyntax* syntax) const {

    auto& comp = context.getCompilation();
    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    auto guard = ScopeGuard([this] { recursionDepth--; });
    if (++recursionDepth > comp.getOptions().maxRecursiveClassSpecialization) {
        context.addDiag(diag::RecursiveClassSpecialization, instanceLoc) << name;
        return &comp.getErrorType();
    }

    // Create a class type instance to hold the parameters. If it turns out we already
    // have this specialization cached we'll throw it away, but that's not a big deal.
    auto classType = comp.emplace<ClassType>(comp, name, location);
    classType->genericClass = this;
    classType->isUninstantiated = forceInvalidParams || context.scope->isUninstantiated();
    classType->setParent(*scope, getIndex());

    // If this is for the default specialization, `syntax` will be null.
    // We want to suppress errors about params not having values and just
    // return null so that the caller can figure out if this is actually a problem.
    const bool isForDefault = syntax == nullptr;

    ParameterBuilder paramBuilder(*context.scope, name, paramDecls);
    paramBuilder.setForceInvalidValues(forceInvalidParams);
    paramBuilder.setSuppressErrors(isForDefault);
    paramBuilder.setInstanceContext(context);
    if (syntax)
        paramBuilder.setAssignments(*syntax, /* isFromConfig */ false);

    SourceRange instRange = {instanceLoc, instanceLoc + 1};

    SmallVector<const ConstantValue*> paramValues;
    SmallVector<const Type*> typeParams;
    for (auto& decl : paramDecls) {
        auto& param = paramBuilder.createParam(decl, *classType, instanceLoc);
        if (paramBuilder.hasErrors()) {
            if (isForDefault)
                return nullptr;

            // Otherwise use an error type instead.
            return &comp.getErrorType();
        }

        if (!param.isLocalParam()) {
            auto& sym = param.symbol;
            if (sym.kind == SymbolKind::Parameter) {
                auto& ps = sym.as<ParameterSymbol>();
                paramValues.push_back(&ps.getValue(instRange));
            }
            else {
                auto& tps = sym.as<TypeParameterSymbol>();
                typeParams.push_back(&tps.targetType.getType());
            }
        }
    }

    if (!forceInvalidParams) {
        detail::ClassSpecializationKey key(paramValues.copy(comp), typeParams.copy(comp));
        if (classType->isUninstantiated) {
            // If we're in an uninstantiated scope we save this specialization
            // in a separate map so that we don't try to elaborate it further
            // and potentially cause spurious errors to be issued.
            auto [it, inserted] = uninstantiatedSpecMap.emplace(key, classType);
            if (!inserted)
                return it->second;
        }
        else {
            auto [it, inserted] = specMap.emplace(key, classType);
            if (!inserted)
                return it->second;
        }
    }

    // Not found, so this is a new entry. Fill in its members and store the
    // specialization for later lookup. If we have a specialization function,
    // call that instead of trying to create from our syntax node.
    if (specializeFunc)
        specializeFunc(comp, *classType, instanceLoc);
    else
        classType->populate(*scope, getSyntax()->as<ClassDeclarationSyntax>());

    return classType;
}